

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O1

void __thiscall
btMultiBody::btMultiBody
          (btMultiBody *this,int n_links,btScalar mass,btVector3 *inertia,bool fixedBase,
          bool canSleep,bool param_6)

{
  undefined8 *puVar1;
  int iVar2;
  btMultibodyLink *pbVar3;
  btMatrix3x3 *pbVar4;
  undefined8 uVar5;
  btMultibodyLink *pbVar6;
  long lVar7;
  btMatrix3x3 *pbVar8;
  int iVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  void *__dest;
  long lVar12;
  byte bVar13;
  uint uStack_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar13 = 0;
  this->_vptr_btMultiBody = (_func_int **)&PTR__btMultiBody_00228d00;
  this->m_baseCollider = (btMultiBodyLinkCollider *)0x0;
  this->m_baseName = (char *)0x0;
  (this->m_basePos).m_floats[0] = 0.0;
  (this->m_basePos).m_floats[1] = 0.0;
  (this->m_basePos).m_floats[2] = 0.0;
  (this->m_basePos).m_floats[3] = 0.0;
  *(undefined8 *)((this->m_basePos).m_floats + 3) = 0;
  (this->m_baseQuat).super_btQuadWord.m_floats[1] = 0.0;
  (this->m_baseQuat).super_btQuadWord.m_floats[2] = 0.0;
  (this->m_baseQuat).super_btQuadWord.m_floats[3] = 1.0;
  this->m_baseMass = mass;
  uVar5 = *(undefined8 *)(inertia->m_floats + 2);
  *(undefined8 *)(this->m_baseInertia).m_floats = *(undefined8 *)inertia->m_floats;
  *(undefined8 *)((this->m_baseInertia).m_floats + 2) = uVar5;
  (this->m_links).m_ownsMemory = true;
  (this->m_links).m_data = (btMultibodyLink *)0x0;
  (this->m_links).m_size = 0;
  (this->m_links).m_capacity = 0;
  (this->m_colliders).m_ownsMemory = true;
  (this->m_colliders).m_data = (btMultiBodyLinkCollider **)0x0;
  (this->m_colliders).m_size = 0;
  (this->m_colliders).m_capacity = 0;
  (this->m_deltaV).m_ownsMemory = true;
  (this->m_deltaV).m_data = (float *)0x0;
  (this->m_deltaV).m_size = 0;
  (this->m_deltaV).m_capacity = 0;
  (this->m_realBuf).m_ownsMemory = true;
  (this->m_realBuf).m_data = (float *)0x0;
  (this->m_realBuf).m_size = 0;
  (this->m_realBuf).m_capacity = 0;
  (this->m_vectorBuf).m_ownsMemory = true;
  (this->m_vectorBuf).m_data = (btVector3 *)0x0;
  (this->m_vectorBuf).m_size = 0;
  (this->m_vectorBuf).m_capacity = 0;
  (this->m_matrixBuf).m_ownsMemory = true;
  (this->m_matrixBuf).m_data = (btMatrix3x3 *)0x0;
  (this->m_matrixBuf).m_size = 0;
  (this->m_matrixBuf).m_capacity = 0;
  this->m_fixedBase = fixedBase;
  this->m_awake = true;
  this->m_canSleep = canSleep;
  this->m_sleepTimer = 0.0;
  this->m_linearDamping = 0.04;
  this->m_angularDamping = 0.04;
  this->m_useGyroTerm = true;
  this->m_maxAppliedImpulse = 1000.0;
  this->m_maxCoordinateVelocity = 100.0;
  this->m_hasSelfCollision = true;
  this->__posUpdated = false;
  *(undefined4 *)((long)&this->m_posVarCnt + 3) = 0;
  this->m_dofCount = 0;
  this->m_posVarCnt = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  if ((-1 < n_links) && (n_links != 0)) {
    pbVar6 = (btMultibodyLink *)btAlignedAllocInternal((ulong)(uint)n_links * 600,0x10);
    lVar7 = (long)(this->m_links).m_size;
    if (0 < lVar7) {
      lVar12 = 0;
      do {
        __dest = (void *)((long)(pbVar6->m_inertiaLocal).m_floats + lVar12 + -4);
        pbVar3 = (this->m_links).m_data;
        memcpy(__dest,(void *)((long)(pbVar3->m_inertiaLocal).m_floats + lVar12 + -4),0x208);
        puVar1 = (undefined8 *)
                 ((long)(pbVar3->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar12);
        uVar5 = puVar1[1];
        *(undefined8 *)((long)__dest + 0x208) = *puVar1;
        *(undefined8 *)((long)__dest + 0x210) = uVar5;
        puVar1 = (undefined8 *)
                 ((long)(pbVar3->m_cachedWorldTransform).m_basis.m_el[1].m_floats + lVar12);
        uVar5 = puVar1[1];
        *(undefined8 *)((long)__dest + 0x218) = *puVar1;
        *(undefined8 *)((long)__dest + 0x220) = uVar5;
        puVar1 = (undefined8 *)
                 ((long)(pbVar3->m_cachedWorldTransform).m_basis.m_el[2].m_floats + lVar12);
        uVar5 = puVar1[1];
        *(undefined8 *)((long)__dest + 0x228) = *puVar1;
        *(undefined8 *)((long)__dest + 0x230) = uVar5;
        puVar1 = (undefined8 *)((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats + lVar12);
        uVar5 = puVar1[1];
        *(undefined8 *)((long)__dest + 0x238) = *puVar1;
        *(undefined8 *)((long)__dest + 0x240) = uVar5;
        puVar1 = (undefined8 *)((long)(&pbVar3->m_cachedWorldTransform + 1) + lVar12);
        uVar5 = puVar1[1];
        *(undefined8 *)((long)__dest + 0x248) = *puVar1;
        *(undefined8 *)((long)__dest + 0x250) = uVar5;
        lVar12 = lVar12 + 600;
      } while (lVar7 * 600 - lVar12 != 0);
    }
    pbVar3 = (this->m_links).m_data;
    if (pbVar3 != (btMultibodyLink *)0x0) {
      if ((this->m_links).m_ownsMemory == true) {
        btAlignedFreeInternal(pbVar3);
      }
      (this->m_links).m_data = (btMultibodyLink *)0x0;
    }
    (this->m_links).m_ownsMemory = true;
    (this->m_links).m_data = pbVar6;
    (this->m_links).m_capacity = n_links;
    if (n_links != 0) {
      lVar7 = 0;
      do {
        pbVar6 = (this->m_links).m_data;
        puVar1 = (undefined8 *)((long)(pbVar6->m_inertiaLocal).m_floats + lVar7 + -4);
        *puVar1 = 0x3f8000003f800000;
        puVar1[1] = 0x3f8000003f800000;
        puVar1[2] = 0xffffffff00000000;
        puVar1[3] = 0;
        puVar1[4] = 0x3f80000000000000;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1[8] = 0;
        puVar10 = &local_88;
        puVar11 = puVar1 + 9;
        for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
          *puVar11 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
          puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
        }
        *(undefined4 *)(puVar1 + 0x13) = 0x3f800000;
        memset((void *)((long)pbVar6->m_axes[0].m_bottomVec.m_floats + lVar7 + 4),0,0xac);
        *(undefined8 *)((long)(pbVar6->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar7) =
             0;
        *(undefined8 *)
         ((long)(pbVar6->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar7 + 8) =
             0x3f80000000000000;
        *(undefined8 *)((long)(pbVar6->m_cachedRVector).m_floats + lVar7) = 0;
        *(undefined8 *)((long)(pbVar6->m_cachedRVector).m_floats + lVar7 + 8) = 0;
        *(undefined8 *)((long)(pbVar6->m_appliedForce).m_floats + lVar7) = 0;
        *(undefined8 *)((long)(pbVar6->m_appliedForce).m_floats + lVar7 + 8) = 0;
        *(undefined8 *)((long)(pbVar6->m_appliedTorque).m_floats + lVar7) = 0;
        *(undefined8 *)((long)(pbVar6->m_appliedTorque).m_floats + lVar7 + 8) = 0;
        *(undefined8 *)((long)pbVar6->m_jointPos + lVar7) = 0;
        *(undefined8 *)((long)pbVar6->m_jointPos + lVar7 + 8) = 0x3f80000000000000;
        *(undefined8 *)((long)pbVar6->m_jointPos + lVar7 + 0x10) = 0;
        *(undefined8 *)((long)pbVar6->m_jointPos + lVar7 + 0x18) = 0;
        *(undefined8 *)((long)pbVar6->m_jointTorque + lVar7 + 4) = 0;
        *(undefined8 *)((long)pbVar6->m_jointTorque + lVar7 + 0xc) = 0;
        *(undefined4 *)((long)pbVar6->m_jointTorque + lVar7 + 0x14) = 0;
        *(ulong *)((long)pbVar6->m_jointTorque + lVar7 + 0x18) = (ulong)uStack_a0;
        *(undefined8 *)
         ((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar7 + -0x1c) = 0;
        *(undefined8 *)
         ((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar7 + -0x14) = 0;
        *(undefined4 *)
         ((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar7 + -0xc) = 5;
        *(undefined8 *)
         ((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar7 + -8) = 0;
        *(undefined4 *)((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar7) =
             0x3f800000;
        *(undefined8 *)((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar7 + 4)
             = 0;
        *(undefined8 *)
         ((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar7 + 0xc) = 0;
        *(undefined4 *)((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[1].m_floats + lVar7 + 4)
             = 0x3f800000;
        *(undefined8 *)((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[1].m_floats + lVar7 + 8)
             = 0;
        *(undefined8 *)((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[2].m_floats + lVar7) = 0
        ;
        *(undefined4 *)((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[2].m_floats + lVar7 + 8)
             = 0x3f800000;
        *(undefined4 *)((long)(&pbVar6->m_cachedWorldTransform + 1) + lVar7 + 0xc) = 0;
        *(undefined8 *)((long)(pbVar6->m_cachedWorldTransform).m_origin.m_floats + lVar7 + 0xc) = 0;
        *(undefined8 *)((long)(&pbVar6->m_cachedWorldTransform + 1) + lVar7 + 4) = 0;
        *(undefined8 *)
         ((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[2].m_floats + lVar7 + 0xc) = 0;
        *(undefined8 *)((long)(pbVar6->m_cachedWorldTransform).m_origin.m_floats + lVar7 + 4) = 0;
        lVar7 = lVar7 + 600;
      } while ((ulong)(uint)n_links * 600 - lVar7 != 0);
    }
  }
  (this->m_links).m_size = n_links;
  iVar9 = n_links + 1;
  iVar2 = (this->m_matrixBuf).m_size;
  if (((iVar2 <= iVar9) && (iVar2 <= n_links)) && ((this->m_matrixBuf).m_capacity <= n_links)) {
    if (iVar9 == 0) {
      pbVar8 = (btMatrix3x3 *)0x0;
    }
    else {
      pbVar8 = (btMatrix3x3 *)btAlignedAllocInternal((long)iVar9 * 0x30,0x10);
    }
    lVar7 = (long)(this->m_matrixBuf).m_size;
    if (0 < lVar7) {
      lVar12 = 0;
      do {
        pbVar4 = (this->m_matrixBuf).m_data;
        puVar1 = (undefined8 *)((long)pbVar4->m_el[0].m_floats + lVar12);
        uVar5 = puVar1[1];
        puVar10 = (undefined8 *)((long)pbVar8->m_el[0].m_floats + lVar12);
        *puVar10 = *puVar1;
        puVar10[1] = uVar5;
        puVar1 = (undefined8 *)((long)pbVar4->m_el[1].m_floats + lVar12);
        uVar5 = puVar1[1];
        puVar10 = (undefined8 *)((long)pbVar8->m_el[1].m_floats + lVar12);
        *puVar10 = *puVar1;
        puVar10[1] = uVar5;
        puVar10 = (undefined8 *)((long)pbVar4->m_el[2].m_floats + lVar12);
        uVar5 = puVar10[1];
        puVar1 = (undefined8 *)((long)pbVar8->m_el[2].m_floats + lVar12);
        *puVar1 = *puVar10;
        puVar1[1] = uVar5;
        lVar12 = lVar12 + 0x30;
      } while (lVar7 * 0x30 != lVar12);
    }
    pbVar4 = (this->m_matrixBuf).m_data;
    if (pbVar4 != (btMatrix3x3 *)0x0) {
      if ((this->m_matrixBuf).m_ownsMemory == true) {
        btAlignedFreeInternal(pbVar4);
      }
      (this->m_matrixBuf).m_data = (btMatrix3x3 *)0x0;
    }
    (this->m_matrixBuf).m_ownsMemory = true;
    (this->m_matrixBuf).m_data = pbVar8;
    (this->m_matrixBuf).m_capacity = iVar9;
  }
  (this->m_matrixBuf).m_size = iVar9;
  (this->m_baseForce).m_floats[0] = 0.0;
  (this->m_baseForce).m_floats[1] = 0.0;
  (this->m_baseForce).m_floats[2] = 0.0;
  (this->m_baseForce).m_floats[3] = 0.0;
  (this->m_baseTorque).m_floats[0] = 0.0;
  (this->m_baseTorque).m_floats[1] = 0.0;
  (this->m_baseTorque).m_floats[2] = 0.0;
  (this->m_baseTorque).m_floats[3] = 0.0;
  return;
}

Assistant:

btMultiBody::btMultiBody(int n_links,
                     btScalar mass,
                     const btVector3 &inertia,
                     bool fixedBase,
                     bool canSleep,
		     bool /*deprecatedUseMultiDof*/)
    : 
    	m_baseCollider(0),
		m_baseName(0),
    	m_basePos(0,0,0),
    	m_baseQuat(0, 0, 0, 1),
      m_baseMass(mass),
      m_baseInertia(inertia),
    
		m_fixedBase(fixedBase),
		m_awake(true),
		m_canSleep(canSleep),
		m_sleepTimer(0),
		
		m_linearDamping(0.04f),
		m_angularDamping(0.04f),
		m_useGyroTerm(true),
			m_maxAppliedImpulse(1000.f),
		m_maxCoordinateVelocity(100.f),
			m_hasSelfCollision(true),		
		__posUpdated(false),
			m_dofCount(0),
		m_posVarCnt(0),
		m_useRK4(false), 	
		m_useGlobalVelocities(false),
		m_internalNeedsJointFeedback(false)
{
	m_links.resize(n_links);
	m_matrixBuf.resize(n_links + 1);


    m_baseForce.setValue(0, 0, 0);
    m_baseTorque.setValue(0, 0, 0);
}